

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

void nowtech::log::
     Log<nowtech::log::QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>,_nowtech::log::SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>,_(signed_char)'\x02',_(nowtech::log::TaskRepresentation)2,_0UL,_444U>
     ::transmitterTaskFunction(void)

{
  bool bVar1;
  tMessage message;
  tagged_ptr<boost::lockfree::queue<nowtech::log::MessageCompact<8UL,_true>_>::node> local_28;
  byte local_1e;
  uint8_t local_1c;
  tagged_ptr<boost::lockfree::queue<nowtech::log::MessageCompact<8UL,_true>_>::node> local_18;
  
  do {
    if (((byte)sKeepAliveTask._M_base._M_i & 1) == 0) {
      local_28 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
                 ::sQueue.mQueue.head_._M_i.ptr;
      local_18 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
                 ::sQueue.mQueue.tail_._M_i.ptr;
      if ((((ulong)QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
                   ::sQueue.mQueue.head_._M_i.ptr ^
           (ulong)QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
                  ::sQueue.mQueue.tail_._M_i.ptr) & 0xffffffffffff) == 0) {
        LOCK();
        AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::sSemaphore.mNotified._M_base._M_i =
             (__atomic_base<bool>)true;
        UNLOCK();
        std::condition_variable::notify_one();
        return;
      }
    }
    bVar1 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
            ::FreeRtosQueue::pop
                      (&QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
                        ::sQueue,(MessageCompact<8UL,_true> *)&local_28,0x1bc);
    if (bVar1) {
      if (local_1c == '\x01') {
        LOCK();
        sTaskShutdowns->_M_elems[local_1e]._M_base._M_i = true;
        UNLOCK();
      }
      else {
        checkAndInsertAndTransmit(local_1e,(tMessage *)&local_28);
      }
    }
  } while( true );
}

Assistant:

static void transmitterTaskFunction() noexcept {
    while(sKeepAliveTask || !tQueue::empty()) {
      tMessage message;
      if(tQueue::pop(message, tRefreshPeriod)) {
        TaskId taskId = message.getTaskId();
        if constexpr(csSendInBackground) {
          if (message.isShutdown()) {
            (*sTaskShutdowns)[taskId] = true;
          }
          else {
            checkAndInsertAndTransmit(taskId, message);
          }
        }
        else {
          checkAndInsertAndTransmit(taskId, message);
        }
      }
      else { // nothing to do
      }
    }
    tAppInterface::finish();
  }